

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdtFunc.h
# Opt level: O2

void SDT::commonCal(TreeNode *treeNode,SDTNode *fa,SDTNode *now,string *code)

{
  Elist *this;
  size_type sVar1;
  mapped_type *pmVar2;
  int iVar3;
  string *psVar4;
  allocator local_e2;
  allocator local_e1;
  TreeNode *local_e0;
  string *local_d8;
  string local_d0;
  string local_b0;
  string p;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this = (Elist *)operator_new(0x40);
  Elist::Elist(this);
  p._M_dataplus._M_p = (pointer)this;
  std::vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>>::emplace_back<SDT::SDTNode*>
            ((vector<SDT::SDTNode*,std::allocator<SDT::SDTNode*>> *)&now->sons,(SDTNode **)&p);
  (**(this->super_SDTNode)._vptr_SDTNode)
            (this,resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  (treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[3],now);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *)funcs_abi_cxx11_,
                  &resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [(treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[1]].attr);
  if (sVar1 == 0) {
    iVar3 = treeNode->lineNum;
    std::operator+(&local_50,"Function not declared ",
                   &resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(treeNode->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[1]].attr);
    ERROR(iVar3,&local_50);
    psVar4 = &local_50;
  }
  else {
    iVar3 = 0;
    local_d8 = DAT_00121438;
    local_e0 = treeNode;
    for (psVar4 = q_abi_cxx11_; psVar4 != local_d8; psVar4 = psVar4 + 1) {
      std::__cxx11::string::string((string *)&p,"param",(allocator *)&local_70);
      std::__cxx11::string::string((string *)&local_b0,"_",&local_e1);
      std::__cxx11::string::string((string *)&local_d0,"_",&local_e2);
      gen(&p,&local_b0,&local_d0,psVar4);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&p);
      iVar3 = iVar3 + 1;
    }
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)funcs_abi_cxx11_,
                          &resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>.
                           _M_impl.super__Vector_impl_data._M_start
                           [(local_e0->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[1]].attr);
    std::__cxx11::to_string(&p,*pmVar2);
    std::__cxx11::string::string((string *)&local_b0,"call",&local_e1);
    std::__cxx11::to_string(&local_d0,iVar3);
    std::__cxx11::string::string((string *)&local_70,"_",&local_e2);
    gen(&local_b0,&local_d0,&local_70,
        &resultTree.super__Vector_base<TreeNode,_std::allocator<TreeNode>_>._M_impl.
         super__Vector_impl_data._M_start
         [(local_e0->sons).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[1]].attr);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    psVar4 = &p;
  }
  std::__cxx11::string::~string((string *)psVar4);
  return;
}

Assistant:

void commonCal(TreeNode &treeNode,SDTNode *fa,SDTNode *now,string &code){
        Elist *elist_1 = new Elist;
        now->sons.push_back(elist_1);
        elist_1->dfs(resultTree[treeNode.sons[3]],now);
        if(!funcs.count(TNAME(1))){
            ERROR(treeNode.lineNum ,"Function not declared "+TNAME(1));
            return;
        }
        int n = 0;
        for(auto &t:q){
            n++;
            gen("param","_","_",t);
        }
        string p = to_string(funcs[TNAME(1)]);
        gen("call",to_string(n),"_",TNAME(1));
    }